

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrppm.c
# Opt level: O1

void put_cmyk(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,JDIMENSION rows_supplied)

{
  byte bVar1;
  byte bVar2;
  JDIMENSION JVar3;
  JSAMPROW pJVar4;
  _func_void_j_decompress_ptr_djpeg_dest_ptr *p_Var5;
  ppm_dest_ptr dest;
  long lVar6;
  double dVar7;
  
  JVar3 = cinfo->output_width;
  if (JVar3 != 0) {
    p_Var5 = dinfo[1].start_output;
    pJVar4 = *dinfo->buffer;
    lVar6 = 0;
    do {
      bVar1 = pJVar4[lVar6 * 4 + 1];
      dVar7 = (double)pJVar4[lVar6 * 4 + 3];
      bVar2 = pJVar4[lVar6 * 4 + 2];
      *p_Var5 = (_func_void_j_decompress_ptr_djpeg_dest_ptr)
                (char)(int)(((double)pJVar4[lVar6 * 4] * dVar7) / 255.0 + 0.5);
      p_Var5[1] = SUB41((int)(((double)bVar1 * dVar7) / 255.0 + 0.5),0);
      p_Var5[2] = SUB41((int)(((double)bVar2 * dVar7) / 255.0 + 0.5),0);
      lVar6 = lVar6 + 1;
      p_Var5 = p_Var5 + 3;
    } while (JVar3 != (JDIMENSION)lVar6);
  }
  fwrite(dinfo[1].start_output,1,(size_t)dinfo[1].finish_output,(FILE *)dinfo->output_file);
  return;
}

Assistant:

METHODDEF(void)
put_cmyk(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo,
         JDIMENSION rows_supplied)
{
  ppm_dest_ptr dest = (ppm_dest_ptr)dinfo;
  register char *bufferptr;
  register JSAMPROW ptr;
  register JDIMENSION col;

  ptr = dest->pub.buffer[0];
  bufferptr = dest->iobuffer;
  for (col = cinfo->output_width; col > 0; col--) {
    JSAMPLE r, g, b, c = *ptr++, m = *ptr++, y = *ptr++, k = *ptr++;
    cmyk_to_rgb(c, m, y, k, &r, &g, &b);
    PUTPPMSAMPLE(bufferptr, r);
    PUTPPMSAMPLE(bufferptr, g);
    PUTPPMSAMPLE(bufferptr, b);
  }
  (void)JFWRITE(dest->pub.output_file, dest->iobuffer, dest->buffer_width);
}